

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O2

void GC::MarkPendingRoots(void)

{
  long lVar1;
  long *plVar2;
  uint uVar3;
  long lVar4;
  
  if ((next != (long *)0x0) && (uVar3 = *(uint *)((long)next + 0xc), uVar3 != 0)) {
    while (plVar2 = next, uVar3 != 0) {
      next = curr;
      lVar1 = *plVar2;
      curr = plVar2;
      for (lVar4 = 0; (ulong)uVar3 << 3 != lVar4; lVar4 = lVar4 + 8) {
        CheckBasePointer(*(char **)(lVar1 + lVar4));
      }
      *(undefined4 *)((long)curr + 0xc) = 0;
      uVar3 = *(uint *)((long)next + 0xc);
    }
  }
  return;
}

Assistant:

void GC::MarkPendingRoots()
{
	if(!GC::next)
		return;

	if(GC::next->empty())
		return;

	while(GC::next->size())
	{
		GC_DEBUG_PRINT("Checking new roots\n");

		FastVector<char*> *tmp = GC::curr;
		GC::curr = GC::next;
		GC::next = tmp;

		for(char **c = GC::curr->data, **e = GC::curr->data + GC::curr->size(); c != e; c++)
		{
			GC_DEBUG_PRINT("\tRoot pointer base is %p\n", *c);

			GC::CheckBasePointer(*c);
		}

		GC::curr->clear();
	}

	GC_DEBUG_PRINT("\n");
}